

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_destination_out(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint32_t uVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  if (0 < length) {
    uVar3 = (ulong)(uint)length;
  }
  if (const_alpha == 0xff) {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = BYTE_MUL(dest[uVar2],~src[uVar2] >> 0x18);
      dest[uVar2] = uVar1;
    }
  }
  else {
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar1 = BYTE_MUL(~src[uVar2] >> 0x18,const_alpha);
      uVar1 = BYTE_MUL(dest[uVar2],(uVar1 - const_alpha) + 0xff);
      dest[uVar2] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_destination_out(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(dest[i], plutovg_alpha(~src[i]));
        }
    } else {
        uint32_t cia = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            uint32_t sia = BYTE_MUL(plutovg_alpha(~src[i]), const_alpha) + cia;
            dest[i] = BYTE_MUL(dest[i], sia);
        }
    }
}